

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type * __thiscall
FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>
::dx(value_type *__return_storage_ptr__,
    FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>
    *this,int i)

{
  int iVar1;
  uint uVar2;
  Fad<Fad<double>_> *pFVar3;
  uint uVar4;
  double *pdVar5;
  Fad<double> *pFVar6;
  ulong uVar7;
  value_type vVar8;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> local_a0;
  FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>
  local_90;
  value_type local_80;
  value_type local_60;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> local_40;
  
  FadBinaryMul<FadExpr<FadUnaryMin<Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>::dx
            (&local_60,&this->left_->fadexpr_,i);
  pFVar3 = this->right_;
  local_a0.fadexpr_.right_ = &pFVar3->val_;
  iVar1 = (pFVar3->dx_).num_elts;
  pFVar6 = (pFVar3->dx_).ptr_to_data;
  local_a0.fadexpr_.left_ = &local_60;
  FadBinaryMul<FadExpr<FadUnaryMin<Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>::val
            (&local_80,&this->left_->fadexpr_);
  pFVar6 = pFVar6 + i;
  if (iVar1 == 0) {
    pFVar6 = &pFVar3->defaultVal;
  }
  local_90.right_ = &local_40;
  local_90.left_ = &local_a0;
  __return_storage_ptr__->val_ = pFVar6->val_ * local_80.val_ + local_60.val_ * (pFVar3->val_).val_;
  uVar2 = (pFVar3->val_).dx_.num_elts;
  if ((int)uVar2 < local_60.dx_.num_elts) {
    uVar2 = local_60.dx_.num_elts;
  }
  uVar4 = (pFVar6->dx_).num_elts;
  if ((int)uVar4 <= local_80.dx_.num_elts) {
    uVar4 = local_80.dx_.num_elts;
  }
  if ((int)uVar4 < (int)uVar2) {
    uVar4 = uVar2;
  }
  (__return_storage_ptr__->dx_).num_elts = 0;
  (__return_storage_ptr__->dx_).ptr_to_data = (double *)0x0;
  local_40.fadexpr_.left_ = pFVar6;
  local_40.fadexpr_.right_ = &local_80;
  if ((int)uVar4 < 1) {
    __return_storage_ptr__->defaultVal = 0.0;
  }
  else {
    (__return_storage_ptr__->dx_).num_elts = uVar4;
    pdVar5 = (double *)operator_new__((ulong)uVar4 << 3);
    (__return_storage_ptr__->dx_).ptr_to_data = pdVar5;
    uVar4 = (pFVar6->dx_).num_elts;
    if (local_80.dx_.num_elts < (int)uVar4) {
      local_80.dx_.num_elts = uVar4;
    }
    uVar4 = local_80.dx_.num_elts;
    if (local_80.dx_.num_elts < (int)uVar2) {
      uVar4 = uVar2;
    }
    __return_storage_ptr__->defaultVal = 0.0;
    if (0 < (int)uVar4) {
      uVar7 = 0;
      do {
        vVar8 = FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>
                ::dx(&local_90,(int)uVar7);
        pdVar5[uVar7] = vVar8;
        uVar7 = uVar7 + 1;
      } while (uVar4 != uVar7);
    }
  }
  Fad<double>::~Fad(&local_80);
  Fad<double>::~Fad(&local_60);
  return __return_storage_ptr__;
}

Assistant:

const value_type dx(int i) const {return  left_.dx(i) * right_.val() + right_.dx(i) * left_.val();}